

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int GetLatestDataHokuyo(HOKUYO *pHokuyo,double *pDistances,double *pAngles)

{
  int iVar1;
  int local_2034;
  int local_2030;
  int k;
  int i;
  int nbdatabytes;
  char databuf [8192];
  double *pAngles_local;
  double *pDistances_local;
  HOKUYO *pHokuyo_local;
  
  k = 0;
  databuf._8184_8_ = pAngles;
  memset(&i,0,0x2000);
  k = 0;
  iVar1 = GetLatestHokuyoMessageHokuyo(pHokuyo,(char *)&i,0x2000,&k);
  if (iVar1 == 0) {
    local_2034 = 0;
    for (local_2030 = 0; local_2030 < k; local_2030 = local_2030 + 3) {
      *(double *)(databuf._8184_8_ + (long)local_2034 * 8) =
           ((double)(((local_2034 + pHokuyo->StartingStep) - pHokuyo->FrontStep) +
                    pHokuyo->SlitDivision / 2) * pHokuyo->StepAngleSize * 3.141592653589793) / 180.0
           - 3.141592653589793;
      iVar1 = CharacterDecodingHokuyo((char *)((long)&i + (long)local_2030),3);
      pDistances[local_2034] = (double)iVar1 / 1000.0;
      local_2034 = local_2034 + 1;
    }
    pHokuyo_local._4_4_ = 0;
  }
  else {
    pHokuyo_local._4_4_ = 1;
  }
  return pHokuyo_local._4_4_;
}

Assistant:

inline int GetLatestDataHokuyo(HOKUYO* pHokuyo, double* pDistances, double* pAngles)
{
	char databuf[MAX_NB_BYTES_HOKUYO];
	int nbdatabytes = 0;
	int i = 0, k = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestHokuyoMessageHokuyo(pHokuyo, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	//memset(pHokuyoData, 0, sizeof(HokuyoDATA));
	
	// Note : the scanner rotates in an anti-clockwise direction when viewed from top.

	// 20-5600 mm, 682 pings...
	
	k = 0;
	for (i = 0; i < nbdatabytes; i += 3)
	{
		pAngles[k] = (k+pHokuyo->StartingStep-pHokuyo->FrontStep+pHokuyo->SlitDivision/2)*pHokuyo->StepAngleSize*M_PI/180.0-M_PI;
		pDistances[k] = CharacterDecodingHokuyo(databuf+i, 3)/1000.0;
		k++;
	}


	// File for data : tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);


	//pHokuyo->LastHokuyoData = *pHokuyoData;

	return EXIT_SUCCESS;
}